

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O3

void __thiscall CMU462::Application::draw_hud(Application *this)

{
  Color *c;
  bool bVar1;
  pointer piVar2;
  pointer pcVar3;
  ulong uVar4;
  bool bVar5;
  long lVar6;
  undefined8 uVar7;
  _Alloc_hider _Var8;
  pointer pbVar9;
  float fVar10;
  float x;
  float fVar11;
  undefined4 uVar12;
  string s2;
  string s1;
  Info selectionInfo;
  float local_120;
  string local_108;
  string local_e8;
  string local_c8;
  long *local_a8;
  long local_a0;
  long local_98 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  long local_80;
  size_type local_78 [2];
  string local_68;
  Info local_48;
  
  OSDText::clear(&this->textManager);
  piVar2 = (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar2) {
    (this->messages).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar2;
  }
  bVar1 = (this->super_Renderer).use_hdpi;
  lVar6 = -300;
  if (bVar1 == false) {
    fVar10 = 24.0;
    local_120 = 72.0;
  }
  else {
    lVar6 = -600;
    fVar10 = 48.0;
    local_120 = 160.0;
  }
  x = (float)(lVar6 + this->screenW);
  bVar5 = DynamicScene::Scene::has_selection(this->scene);
  if (bVar5) {
    DynamicScene::Scene::getSelectionInfo_abi_cxx11_(&local_48,this->scene);
    if (local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_48.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      c = &this->text_color;
      pbVar9 = local_48.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      do {
        lVar6 = std::__cxx11::string::find_first_of((char *)pbVar9,0x1e3aa4,0);
        if (lVar6 == -1) {
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          pcVar3 = (pbVar9->_M_dataplus)._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_c8,pcVar3,pcVar3 + pbVar9->_M_string_length);
          draw_string(this,x,local_120,&local_c8,0x10,c);
          uVar7 = local_c8.field_2._M_allocated_capacity;
          _Var8._M_p = local_c8._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c8._M_dataplus._M_p != &local_c8.field_2) goto LAB_001871fa;
        }
        else {
          std::__cxx11::string::substr((ulong)&local_88,(ulong)pbVar9);
          std::__cxx11::string::substr((ulong)&local_a8,(ulong)pbVar9);
          local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_e8,local_88,local_88->_M_local_buf + local_80);
          draw_string(this,x,local_120,&local_e8,0x10,c);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          bVar5 = (this->super_Renderer).use_hdpi;
          local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_108,local_a8,local_a0 + (long)local_a8);
          fVar11 = 150.0;
          if (bVar5 == false) {
            fVar11 = 75.0;
          }
          draw_string(this,fVar11 + x,local_120,&local_108,0x10,c);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108._M_dataplus._M_p != &local_108.field_2) {
            operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
          }
          if (local_a8 != local_98) {
            operator_delete(local_a8,local_98[0] + 1);
          }
          uVar7 = local_78[0];
          _Var8._M_p = (pointer)local_88;
          if (local_88 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78) {
LAB_001871fa:
            operator_delete(_Var8._M_p,uVar7 + 1);
          }
        }
        local_120 = local_120 + fVar10;
        pbVar9 = pbVar9 + 1;
      } while (pbVar9 != local_48.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_48);
  }
  else {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,"No mesh feature is selected","");
    draw_string(this,x,local_120,&local_68,0x10,&this->text_color);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    if (bVar1 == false) {
      local_120 = 96.0;
    }
    else {
      local_120 = 208.0;
    }
  }
  glPushAttrib(0x800);
  glViewport(0,0,(int)this->screenW,(int)this->screenH);
  glMatrixMode(0x1701);
  glPushMatrix();
  glLoadIdentity();
  glOrtho(0,((double)CONCAT44(0x45300000,(int)(this->screenW >> 0x20)) - 1.9342813113834067e+25) +
            ((double)CONCAT44(0x43300000,(int)this->screenW) - 4503599627370496.0),
          ((double)CONCAT44(0x45300000,(int)(this->screenH >> 0x20)) - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)this->screenH) - 4503599627370496.0),0,0,
          0x3ff0000000000000);
  glMatrixMode(0x1700);
  glPushMatrix();
  glLoadIdentity();
  glTranslatef(0,0,0xbf800000);
  glColor4f(0,0,0,0x3f4ccccd);
  if (bVar1 == false) {
    uVar12 = 0x42000000;
  }
  else {
    uVar12 = 0x42c00000;
  }
  uVar4 = this->screenW;
  glDisable(0xb71);
  glDisable(0xb50);
  glBegin(7);
  glVertex3f(x + -32.0,uVar12,0);
  glVertex3f(x + -32.0,local_120,0);
  glVertex3f((float)uVar4,local_120,0);
  glVertex3f((float)uVar4,uVar12,0);
  glEnd();
  glMatrixMode(0x1701);
  glPopMatrix();
  glMatrixMode(0x1700);
  glPopMatrix();
  glPopAttrib();
  glEnable(0xb50);
  glEnable(0xb71);
  OSDText::render(&this->textManager);
  return;
}

Assistant:

void Application::draw_hud() {
  textManager.clear();
  messages.clear();

  const size_t size = 16;
  const float x0 = use_hdpi ? screenW - 300 * 2 : screenW - 300;
  const float y0 = use_hdpi ? 128 : 64;
  const int inc  = use_hdpi ? 48  : 24;
  float y = y0 + inc - size;

  // No selection --> no messages.
  if (!scene->has_selection()) {
    draw_string(x0, y, "No mesh feature is selected", size, text_color);
    y += inc;
  } else {
    Info selectionInfo = scene->getSelectionInfo();
    for (const string& s : selectionInfo) {
      size_t split = s.find_first_of(":");
      if (split != string::npos) {
        split++;
        string s1 = s.substr(0,split);
        string s2 = s.substr(split);
        draw_string(x0, y, s1, size, text_color);
        draw_string(x0 + (use_hdpi ? 150 : 75 ), y, s2, size, text_color);
      } else {
        draw_string(x0, y, s, size, text_color);
      }
      y += inc;
    }
  }

  // -- First draw a lovely black rectangle.

  glPushAttrib(GL_VIEWPORT_BIT);
  glViewport(0, 0, screenW, screenH);

  glMatrixMode(GL_PROJECTION);
  glPushMatrix();
  glLoadIdentity();
  glOrtho(0, screenW, screenH, 0, 0, 1);

  glMatrixMode(GL_MODELVIEW);
  glPushMatrix();
  glLoadIdentity();
  glTranslatef(0, 0, -1);

  // -- Black with opacity .8;

  glColor4f(0.0, 0.0, 0.0, 0.8);

  float min_x = x0 - 32;
  float min_y = y0 - 32;
  float max_x = screenW;
  float max_y = y;

  float z = 0.0;

  glDisable(GL_DEPTH_TEST);
  glDisable(GL_LIGHTING);

  glBegin(GL_QUADS);

  glVertex3f(min_x, min_y, z);
  glVertex3f(min_x, max_y, z);
  glVertex3f(max_x, max_y, z);
  glVertex3f(max_x, min_y, z);
  glEnd();

  glMatrixMode(GL_PROJECTION);
  glPopMatrix();

  glMatrixMode(GL_MODELVIEW);
  glPopMatrix();

  glPopAttrib();

  glEnable(GL_LIGHTING);
  glEnable(GL_DEPTH_TEST);

  textManager.render();
}